

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CodeRhsOfIN(Parse *pParse,Expr *pExpr,int iTab)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  Vdbe *p;
  Select *pVector;
  ExprList *pEVar4;
  Vdbe *pVVar5;
  SubrtnSig *pSVar6;
  int iVar7;
  int addr;
  KeyInfo *zP4;
  uint *zP4_00;
  char *pcVar8;
  CollSeq *pCVar9;
  Select *pSVar10;
  Expr *pEVar11;
  int iVar12;
  Op *pOVar13;
  u8 uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  sqlite3 *db;
  ExprList **ppEVar18;
  int iVar19;
  ExprList_item *pEVar20;
  Op *pOVar21;
  long in_FS_OFFSET;
  bool bVar23;
  int local_b0;
  int local_74;
  char local_69;
  undefined1 local_68 [32];
  undefined8 uStack_48;
  anon_union_8_18_67db040d_for_u local_40;
  long local_38;
  Op *pOVar22;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p = pParse->pVdbe;
  if (((pExpr->flags & 0x40) == 0) && (pParse->iSelfTab == 0)) {
    if ((((pExpr->flags >> 0xc & 1) == 0) || ((((pExpr->x).pList)->nAlloc & 2) != 0)) ||
       (zP4_00 = (uint *)sqlite3DbMallocRawNN(pParse->db,0x20), zP4_00 == (uint *)0x0)) {
      zP4_00 = (uint *)0x0;
    }
    else {
      *zP4_00 = ((pExpr->x).pSelect)->selId;
      pcVar8 = exprINAffinity(pParse,pExpr);
      *(char **)(zP4_00 + 2) = pcVar8;
    }
    uVar16 = pExpr->flags;
    if ((uVar16 >> 0x19 & 1) == 0) {
      if (((zP4_00 == (uint *)0x0) ||
          (uVar3 = *zP4_00, (pParse->mSubrtnSig >> (uVar3 & 7) & 1) == 0)) ||
         (pVVar5 = pParse->pVdbe, pVVar5->db->mallocFailed != '\0')) {
LAB_0017d9cd:
        pExpr->flags = uVar16 | 0x2000000;
        iVar12 = pParse->nMem + 1;
        pParse->nMem = iVar12;
        (pExpr->y).sub.regReturn = iVar12;
        iVar12 = sqlite3VdbeAddOp3(p,0x4a,0,iVar12,0);
        (pExpr->y).sub.iAddr = iVar12 + 1;
        if (zP4_00 != (uint *)0x0) {
          *(byte *)(zP4_00 + 1) = 0;
          zP4_00[5] = (pExpr->y).sub.iAddr;
          zP4_00[6] = (pExpr->y).sub.regReturn;
          zP4_00[4] = iTab;
          pParse->mSubrtnSig = (u8)(1 << ((byte)*zP4_00 & 7));
          sqlite3VdbeChangeP4(p,-1,(char *)zP4_00,-0x11);
        }
        iVar12 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
        goto LAB_0017d78e;
      }
      pOVar13 = pVVar5->aOp;
      iVar12 = pVVar5->nOp;
      pOVar21 = pOVar13;
      do {
        pOVar22 = pOVar21;
        pOVar21 = pOVar22 + 1;
        if (pOVar13 + (long)iVar12 + -1 <= pOVar21) goto LAB_0017d9cd;
      } while ((((pOVar22[1].p4type != -0x11) ||
                (pSVar6 = pOVar22[1].p4.pSubrtnSig, pSVar6->bComplete == '\0')) ||
               (uVar3 != pSVar6->selId)) ||
              (iVar7 = strcmp(*(char **)(zP4_00 + 2),pSVar6->zAff), iVar7 != 0));
      (pExpr->y).sub.iAddr = pSVar6->iAddr;
      (pExpr->y).sub.regReturn = pSVar6->regReturn;
      pExpr->iTable = pSVar6->iTable;
      pExpr->flags = uVar16 | 0x2000000;
    }
    iVar12 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
    if ((pExpr->flags & 0x1000) != 0) {
      sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pExpr->x).pSelect)->selId);
    }
    sqlite3VdbeAddOp3(p,10,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,0);
    sqlite3VdbeAddOp3(p,0x72,iTab,pExpr->iTable,0);
    if (p->db->mallocFailed == '\0') {
      pOVar13 = p->aOp + iVar12;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->p2 = p->nOp;
    if (zP4_00 != (uint *)0x0) {
      if (*(void **)(zP4_00 + 2) != (void *)0x0) {
        sqlite3DbFreeNN(pParse->db,*(void **)(zP4_00 + 2));
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        sqlite3DbFreeNN(pParse->db,zP4_00);
        return;
      }
      goto LAB_0017dfc1;
    }
  }
  else {
    zP4_00 = (uint *)0x0;
    iVar12 = 0;
LAB_0017d78e:
    pVector = (Select *)pExpr->pLeft;
    uVar14 = pVector->op;
    if (uVar14 == 0xb0) {
      uVar14 = *(u8 *)&pVector->nSelectRow;
    }
    pSVar10 = pVector;
    if (uVar14 == 0xb1) {
LAB_0017d7ba:
      uVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar10->pEList)->pList->nExpr;
    }
    else {
      uVar16 = 1;
      if (uVar14 == 0x8b) {
        pSVar10 = ((anon_union_8_2_a01b6dbf_for_x *)&pVector->pEList)->pSelect;
        goto LAB_0017d7ba;
      }
    }
    pExpr->iTable = iTab;
    iVar7 = sqlite3VdbeAddOp3(p,0x75,iTab,uVar16,0);
    zP4 = sqlite3KeyInfoAlloc(pParse->db,uVar16,1);
    pSVar10 = (Select *)(pExpr->x).pList;
    if ((pExpr->flags & 0x1000) == 0) {
      if (pSVar10 != (Select *)0x0) {
        local_69 = sqlite3ExprAffinity((Expr *)pVector);
        if (local_69 < 'A') {
          local_69 = 'A';
        }
        else if (local_69 == 'E') {
          local_69 = 'C';
        }
        if (zP4 != (KeyInfo *)0x0) {
          pCVar9 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
          zP4->aColl[0] = pCVar9;
        }
        uVar14 = pParse->nTempReg;
        if (uVar14 == '\0') {
          iVar17 = pParse->nMem + 1;
          pParse->nMem = iVar17;
LAB_0017dadc:
          local_b0 = pParse->nMem + 1;
          pParse->nMem = local_b0;
        }
        else {
          bVar2 = uVar14 - 1;
          pParse->nTempReg = bVar2;
          iVar17 = pParse->aTempReg[bVar2];
          if (bVar2 == 0) goto LAB_0017dadc;
          pParse->nTempReg = uVar14 - 2;
          local_b0 = pParse->aTempReg[(byte)(uVar14 - 2)];
        }
        if (0 < *(int *)pSVar10) {
          ppEVar18 = (ExprList **)&pSVar10->iLimit;
          iVar19 = *(int *)pSVar10 + 1;
          do {
            pEVar11 = (Expr *)*ppEVar18;
            if (iVar12 == 0) {
LAB_0017db93:
              iVar12 = 0;
            }
            else {
              local_40.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
              local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
              uStack_48 = (ExprList *)0xaaaa0001aaaaaaaa;
              local_68._8_8_ = exprNodeIsConstant;
              local_68._16_8_ = sqlite3SelectWalkFail;
              local_68._0_8_ = pParse;
              if (pEVar11 != (Expr *)0x0) {
                sqlite3WalkExprNN((Walker *)local_68,pEVar11);
                if (uStack_48._4_2_ == 0) {
                  sqlite3VdbeChangeToNoop(p,iVar12 + -1);
                  sqlite3VdbeChangeToNoop(p,iVar12);
                  pbVar1 = (byte *)((long)&pExpr->flags + 3);
                  *pbVar1 = *pbVar1 & 0xfd;
                  goto LAB_0017db93;
                }
              }
            }
            sqlite3ExprCode(pParse,pEVar11,iVar17);
            addr = sqlite3VdbeAddOp3(p,0x61,iVar17,1,local_b0);
            sqlite3VdbeChangeP4(p,addr,&local_69,1);
            sqlite3VdbeAddOp4Int(p,0x8a,iTab,local_b0,iVar17,1);
            ppEVar18 = ppEVar18 + 3;
            iVar19 = iVar19 + -1;
          } while (1 < iVar19);
        }
        if (iVar17 != 0) {
          bVar2 = pParse->nTempReg;
          if ((ulong)bVar2 < 8) {
            pParse->nTempReg = bVar2 + 1;
            pParse->aTempReg[bVar2] = iVar17;
          }
        }
        if (local_b0 != 0) {
          bVar2 = pParse->nTempReg;
          if ((ulong)bVar2 < 8) {
            pParse->nTempReg = bVar2 + 1;
            pParse->aTempReg[bVar2] = local_b0;
          }
        }
      }
    }
    else {
      pEVar4 = pSVar10->pEList;
      sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d");
      if (pEVar4->nExpr == uVar16) {
        local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        uStack_48 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
        local_68._4_4_ = iTab;
        local_68._0_4_ = 0xaaaaaa0b;
        local_68._8_8_ = (_func_int_Walker_ptr_Expr_ptr *)0x0;
        local_68._16_8_ = (_func_int_Walker_ptr_Select_ptr *)0xaaaaaaaa00000000;
        local_68._24_8_ = exprINAffinity(pParse,pExpr);
        local_74 = 0;
        pSVar10->iLimit = 0;
        db = pParse->db;
        if ((iVar12 != 0) && ((db->dbOptFlags & 0x80000) == 0)) {
          iVar17 = pParse->nMem + 1;
          pParse->nMem = iVar17;
          local_74 = sqlite3VdbeAddOp3(p,0x4d,10000,iVar17,0);
          local_68._8_4_ = iVar17;
          db = pParse->db;
        }
        bVar23 = false;
        pSVar10 = sqlite3SelectDup(db,pSVar10,0);
        if (pParse->db->mallocFailed == '\0') {
          iVar17 = sqlite3Select(pParse,pSVar10,(SelectDest *)local_68);
          bVar23 = iVar17 == 0;
        }
        if (pSVar10 != (Select *)0x0) {
          clearSelect(pParse->db,pSVar10,1);
        }
        if ((_func_void_Walker_ptr_Select_ptr *)local_68._24_8_ !=
            (_func_void_Walker_ptr_Select_ptr *)0x0) {
          sqlite3DbFreeNN(pParse->db,(void *)local_68._24_8_);
        }
        if (local_74 != 0) {
          if (p->db->mallocFailed == '\0') {
            pOVar13 = p->aOp;
            pOVar13[iVar12].p3 = local_68._8_4_;
            if (local_68._8_4_ == 0) goto LAB_0017dd1f;
            pOVar13 = pOVar13 + iVar12;
          }
          else {
            DAT_0024134c = local_68._8_4_;
            if (local_68._8_4_ == 0) {
LAB_0017dd1f:
              sqlite3VdbeChangeToNoop(p,local_74);
              goto LAB_0017dd29;
            }
            pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar13->p3 = local_68._8_4_;
        }
LAB_0017dd29:
        if (!bVar23) {
          if ((zP4 != (KeyInfo *)0x0) && (zP4->nRef = zP4->nRef - 1, zP4->nRef == 0)) {
            sqlite3DbNNFreeNN(zP4->db,zP4);
          }
          goto LAB_0017de16;
        }
        if (0 < (int)uVar16) {
          pEVar20 = pEVar4->a;
          uVar15 = 0;
          do {
            pEVar11 = sqlite3VectorFieldSubexpr((Expr *)pVector,(int)uVar15);
            pCVar9 = sqlite3BinaryCompareCollSeq(pParse,pEVar11,pEVar20->pExpr);
            zP4->aColl[uVar15] = pCVar9;
            uVar15 = uVar15 + 1;
            pEVar20 = pEVar20 + 1;
          } while (uVar16 != uVar15);
        }
      }
    }
    if (zP4_00 != (uint *)0x0) {
      *(byte *)(zP4_00 + 1) = 1;
    }
    if (zP4 != (KeyInfo *)0x0) {
      sqlite3VdbeChangeP4(p,iVar7,(char *)zP4,-8);
    }
    if (iVar12 != 0) {
      sqlite3VdbeAddOp3(p,0x88,iTab,0,0);
      if (p->db->mallocFailed == '\0') {
        pOVar13 = p->aOp + iVar12;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar13->p2 = p->nOp;
      sqlite3VdbeAddOp3(p,0x43,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,1);
      pParse->nTempReg = '\0';
      pParse->nRangeReg = 0;
    }
  }
LAB_0017de16:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0017dfc1:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRhsOfIN(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN operator */
  int iTab                /* Use this cursor number */
){
  int addrOnce = 0;           /* Address of the OP_Once instruction at top */
  int addr;                   /* Address of OP_OpenEphemeral instruction */
  Expr *pLeft;                /* the LHS of the IN operator */
  KeyInfo *pKeyInfo = 0;      /* Key information */
  int nVal;                   /* Size of vector pLeft */
  Vdbe *v;                    /* The prepared statement under construction */
  SubrtnSig *pSig = 0;        /* Signature for this subroutine */

  v = pParse->pVdbe;
  assert( v!=0 );

  /* The evaluation of the IN must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can compute the RHS just once
  ** and reuse it many names.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) && pParse->iSelfTab==0 ){
    /* Reuse of the RHS is allowed
    **
    ** Compute a signature for the RHS of the IN operator to facility
    ** finding and reusing prior instances of the same IN operator.
    */
    assert( !ExprUseXSelect(pExpr) || pExpr->x.pSelect!=0 );
    if( ExprUseXSelect(pExpr) && (pExpr->x.pSelect->selFlags & SF_All)==0 ){
      pSig = sqlite3DbMallocRawNN(pParse->db, sizeof(pSig[0]));
      if( pSig ){
        pSig->selId = pExpr->x.pSelect->selId;
        pSig->zAff = exprINAffinity(pParse, pExpr);
      }
    }

    /* Check to see if there is a prior materialization of the RHS of
    ** this IN operator.  If there is, then make use of that prior
    ** materialization rather than recomputing it.
    */
    if( ExprHasProperty(pExpr, EP_Subrtn)
     || findCompatibleInRhsSubrtn(pParse, pExpr, pSig)
    ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      if( ExprUseXSelect(pExpr) ){
        ExplainQueryPlan((pParse, 0, "REUSE LIST SUBQUERY %d",
              pExpr->x.pSelect->selId));
      }
      assert( ExprUseYSub(pExpr) );
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      assert( iTab!=pExpr->iTable );
      sqlite3VdbeAddOp2(v, OP_OpenDup, iTab, pExpr->iTable);
      sqlite3VdbeJumpHere(v, addrOnce);
      if( pSig ){
        sqlite3DbFree(pParse->db, pSig->zAff);
        sqlite3DbFree(pParse->db, pSig);
      }
      return;
    }

    /* Begin coding the subroutine */
    assert( !ExprUseYWin(pExpr) );
    ExprSetProperty(pExpr, EP_Subrtn);
    assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_BeginSubrtn, 0, pExpr->y.sub.regReturn) + 1;
    if( pSig ){
      pSig->bComplete = 0;
      pSig->iAddr = pExpr->y.sub.iAddr;
      pSig->regReturn = pExpr->y.sub.regReturn;
      pSig->iTable = iTab;
      pParse->mSubrtnSig = 1 << (pSig->selId&7);
      sqlite3VdbeChangeP4(v, -1, (const char*)pSig, P4_SUBRTNSIG);
    }
    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* Check to see if this is a vector IN operator */
  pLeft = pExpr->pLeft;
  nVal = sqlite3ExprVectorSize(pLeft);

  /* Construct the ephemeral table that will contain the content of
  ** RHS of the IN operator.
  */
  pExpr->iTable = iTab;
  addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, nVal);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  if( ExprUseXSelect(pExpr) ){
    VdbeComment((v, "Result of SELECT %u", pExpr->x.pSelect->selId));
  }else{
    VdbeComment((v, "RHS of IN operator"));
  }
#endif
  pKeyInfo = sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

  if( ExprUseXSelect(pExpr) ){
    /* Case 1:     expr IN (SELECT ...)
    **
    ** Generate code to write the results of the select into the temporary
    ** table allocated and opened above.
    */
    Select *pSelect = pExpr->x.pSelect;
    ExprList *pEList = pSelect->pEList;

    ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSelect->selId
    ));
    /* If the LHS and RHS of the IN operator do not match, that
    ** error will have been caught long before we reach this point. */
    if( ALWAYS(pEList->nExpr==nVal) ){
      Select *pCopy;
      SelectDest dest;
      int i;
      int rc;
      int addrBloom = 0;
      sqlite3SelectDestInit(&dest, SRT_Set, iTab);
      dest.zAffSdst = exprINAffinity(pParse, pExpr);
      pSelect->iLimit = 0;
      if( addrOnce && OptimizationEnabled(pParse->db, SQLITE_BloomFilter) ){
        int regBloom = ++pParse->nMem;
        addrBloom = sqlite3VdbeAddOp2(v, OP_Blob, 10000, regBloom);
        VdbeComment((v, "Bloom filter"));
        dest.iSDParm2 = regBloom;
      }
      testcase( pSelect->selFlags & SF_Distinct );
      testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
      pCopy = sqlite3SelectDup(pParse->db, pSelect, 0);
      rc = pParse->db->mallocFailed ? 1 :sqlite3Select(pParse, pCopy, &dest);
      sqlite3SelectDelete(pParse->db, pCopy);
      sqlite3DbFree(pParse->db, dest.zAffSdst);
      if( addrBloom ){
        sqlite3VdbeGetOp(v, addrOnce)->p3 = dest.iSDParm2;
        if( dest.iSDParm2==0 ){
          sqlite3VdbeChangeToNoop(v, addrBloom);
        }else{
          sqlite3VdbeGetOp(v, addrOnce)->p3 = dest.iSDParm2;
        }
      }
      if( rc ){
        sqlite3KeyInfoUnref(pKeyInfo);
        return;
      }
      assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
      assert( pEList!=0 );
      assert( pEList->nExpr>0 );
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      for(i=0; i<nVal; i++){
        Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
        pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
            pParse, p, pEList->a[i].pExpr
        );
      }
    }
  }else if( ALWAYS(pExpr->x.pList!=0) ){
    /* Case 2:     expr IN (exprlist)
    **
    ** For each expression, build an index key from the evaluation and
    ** store it in the temporary table. If <expr> is a column, then use
    ** that columns affinity when building index keys. If <expr> is not
    ** a column, use numeric affinity.
    */
    char affinity;            /* Affinity of the LHS of the IN */
    int i;
    ExprList *pList = pExpr->x.pList;
    struct ExprList_item *pItem;
    int r1, r2;
    affinity = sqlite3ExprAffinity(pLeft);
    if( affinity<=SQLITE_AFF_NONE ){
      affinity = SQLITE_AFF_BLOB;
    }else if( affinity==SQLITE_AFF_REAL ){
      affinity = SQLITE_AFF_NUMERIC;
    }
    if( pKeyInfo ){
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    }

    /* Loop through each expression in <exprlist>. */
    r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3GetTempReg(pParse);
    for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
      Expr *pE2 = pItem->pExpr;

      /* If the expression is not constant then we will need to
      ** disable the test that was generated above that makes sure
      ** this code only executes once.  Because for a non-constant
      ** expression we need to rerun this code each time.
      */
      if( addrOnce && !sqlite3ExprIsConstant(pParse, pE2) ){
        sqlite3VdbeChangeToNoop(v, addrOnce-1);
        sqlite3VdbeChangeToNoop(v, addrOnce);
        ExprClearProperty(pExpr, EP_Subrtn);
        addrOnce = 0;
      }

      /* Evaluate the expression and insert it into the temp table */
      sqlite3ExprCode(pParse, pE2, r1);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, r1, 1, r2, &affinity, 1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r2, r1, 1);
    }
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
  if( pSig ) pSig->bComplete = 1;
  if( pKeyInfo ){
    sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
  }
  if( addrOnce ){
    sqlite3VdbeAddOp1(v, OP_NullRow, iTab);
    sqlite3VdbeJumpHere(v, addrOnce);
    /* Subroutine return */
    assert( ExprUseYSub(pExpr) );
    assert( sqlite3VdbeGetOp(v,pExpr->y.sub.iAddr-1)->opcode==OP_BeginSubrtn
            || pParse->nErr );
    sqlite3VdbeAddOp3(v, OP_Return, pExpr->y.sub.regReturn,
                      pExpr->y.sub.iAddr, 1);
    VdbeCoverage(v);
    sqlite3ClearTempRegCache(pParse);
  }
}